

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

void Acb_Ntk4DumpWeightsInt(Acb_Ntk_t *pNtk,Vec_Int_t *vObjs,char *pFileName)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  FILE *__stream;
  Vec_Int_t *p;
  int *piVar6;
  Vec_Int_t *vRes;
  Vec_Int_t *vDists;
  int *piVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  Vec_Int_t t;
  
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Canont open input file \"%s\".\n",pFileName);
    return;
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar6 = (int *)malloc(400);
  p->pArray = piVar6;
  vRes = (Vec_Int_t *)malloc(0x10);
  vRes->nCap = 100;
  vRes->nSize = 0;
  piVar6 = (int *)malloc(400);
  vRes->pArray = piVar6;
  iVar1 = (pNtk->vObjType).nSize;
  vDists = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar10 = iVar1;
  }
  vDists->nSize = 0;
  vDists->nCap = iVar10;
  if (iVar10 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar10 << 2);
  }
  vDists->pArray = piVar6;
  vDists->nSize = iVar1;
  if (piVar6 != (int *)0x0) {
    memset(piVar6,0,(long)iVar1 * 4);
  }
  if ((pNtk->vObjTrav).nSize < 1) {
    uVar2 = (pNtk->vObjType).nCap;
    if ((pNtk->vObjTrav).nCap < (int)uVar2) {
      piVar7 = (pNtk->vObjTrav).pArray;
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc((long)(int)uVar2 << 2);
      }
      else {
        piVar7 = (int *)realloc(piVar7,(long)(int)uVar2 << 2);
      }
      (pNtk->vObjTrav).pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vObjTrav).nCap = uVar2;
    }
    if (0 < (int)uVar2) {
      memset((pNtk->vObjTrav).pArray,0,(ulong)uVar2 * 4);
    }
    (pNtk->vObjTrav).nSize = uVar2;
  }
  pNtk->nObjTravs = pNtk->nObjTravs + 1;
  if (0 < vObjs->nSize) {
    lVar12 = 0;
    do {
      iVar10 = vObjs->pArray[lVar12];
      lVar11 = (long)iVar10;
      if ((lVar11 < 0) || ((pNtk->vObjTrav).nSize <= iVar10)) goto LAB_003b0f0a;
      (pNtk->vObjTrav).pArray[lVar11] = pNtk->nObjTravs;
      if (iVar1 <= iVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      piVar6[lVar11] = 1;
      Vec_IntPush(p,iVar10);
      lVar12 = lVar12 + 1;
    } while (lVar12 < vObjs->nSize);
  }
  while (Acb_Ntk4CollectRing(pNtk,p,vRes,vDists), vRes->nSize != 0) {
    p->nSize = 0;
    iVar10 = p->nCap;
    iVar3 = p->nSize;
    piVar7 = p->pArray;
    iVar5 = vRes->nSize;
    piVar4 = vRes->pArray;
    p->nCap = vRes->nCap;
    p->nSize = iVar5;
    p->pArray = piVar4;
    vRes->nCap = iVar10;
    vRes->nSize = iVar3;
    vRes->pArray = piVar7;
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (vRes->pArray != (int *)0x0) {
    free(vRes->pArray);
    vRes->pArray = (int *)0x0;
  }
  free(vRes);
  if (1 < (pNtk->vObjType).nSize) {
    uVar13 = 1;
    do {
      if ((long)(pNtk->vObjType).nSize <= (long)uVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      if ((pNtk->vObjType).pArray[uVar13] != '\0') {
        uVar8 = (ulong)(pNtk->vObjName).nSize;
        if ((long)uVar8 < 1) {
          __assert_fail("Acb_NtkHasObjNames(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x10d,"int Acb_ObjName(Acb_Ntk_t *, int)");
        }
        if ((uVar8 <= uVar13) ||
           (pcVar9 = Abc_NamStr(pNtk->pDesign->pStrs,(pNtk->vObjName).pArray[uVar13]),
           (long)iVar1 <= (long)uVar13)) {
LAB_003b0f0a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar8 = (ulong)(piVar6[uVar13] + 100000);
        if (piVar6[uVar13] == 0) {
          uVar8 = 110000;
        }
        fprintf(__stream,"%s %d\n",pcVar9,uVar8);
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)(pNtk->vObjType).nSize);
  }
  if (piVar6 != (int *)0x0) {
    free(piVar6);
    vDists->pArray = (int *)0x0;
  }
  free(vDists);
  fclose(__stream);
  return;
}

Assistant:

void Acb_Ntk4DumpWeightsInt( Acb_Ntk_t * pNtk, Vec_Int_t * vObjs, char * pFileName )
{
    int i, iObj;//, Weight;
    Vec_Int_t * vDists, * vStart, * vNexts;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Canont open input file \"%s\".\n", pFileName );
        return;
    }
    vStart = Vec_IntAlloc( 100 );
    vNexts = Vec_IntAlloc( 100 );
    vDists = Vec_IntStart( Acb_NtkObjNumMax(pNtk) );
    Acb_NtkIncTravId( pNtk );
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        Acb_ObjSetTravIdCur(pNtk, iObj);
        Vec_IntWriteEntry( vDists, iObj, 1 );
        Vec_IntPush( vStart, iObj );
    }    
    while ( 1 )
    {
        Acb_Ntk4CollectRing( pNtk, vStart, vNexts, vDists );
        if ( Vec_IntSize(vNexts) == 0 )
            break;
        Vec_IntClear( vStart );
        ABC_SWAP( Vec_Int_t, *vStart, *vNexts );
    }
    Vec_IntFree( vStart );
    Vec_IntFree( vNexts );
    // create weights
//    Vec_IntForEachEntry( vDists, Weight, i )
//        if ( Weight && Acb_ObjNameStr(pNtk, i)[0] != '1' )
//            fprintf( pFile, "%s %d\n", Acb_ObjNameStr(pNtk, i), 10000+Weight );
    Acb_NtkForEachObj( pNtk, iObj )
    {
        char * pName = Acb_ObjNameStr(pNtk, iObj);
        int Weight = Vec_IntEntry(vDists, iObj);
        if ( Weight == 0 )
            Weight = 10000;
        fprintf( pFile, "%s %d\n", pName, 100000+Weight );
    }

    Vec_IntFree( vDists );
    fclose( pFile );
}